

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_shared_object.hpp
# Opt level: O1

void __thiscall
boost::detail::
sp_counted_impl_pd<PartialJointPolicyPureVector_*,_boost::detail::sp_ms_deleter<PartialJointPolicyPureVector>_>
::dispose(sp_counted_impl_pd<PartialJointPolicyPureVector_*,_boost::detail::sp_ms_deleter<PartialJointPolicyPureVector>_>
          *this)

{
  if ((this->del).initialized_ == true) {
    (**(code **)((long)(this->del).storage_.align_ + 0x18))(&(this->del).storage_);
    (this->del).initialized_ = false;
  }
  return;
}

Assistant:

void destroy()
    {
        if( initialized_ )
        {
#if defined( __GNUC__ )

            // fixes incorrect aliasing warning
            T * p = reinterpret_cast< T* >( storage_.data_ );
            p->~T();

#else

            reinterpret_cast< T* >( storage_.data_ )->~T();

#endif

            initialized_ = false;
        }
    }